

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::ExternUdpDeclSyntax::setChild
          (ExternUdpDeclSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00454070 + *(int *)(&DAT_00454070 + index * 4)))();
  return;
}

Assistant:

void ExternUdpDeclSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: externKeyword = child.token(); return;
        case 2: actualAttributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 3: primitive = child.token(); return;
        case 4: name = child.token(); return;
        case 5: portList = child.node() ? &child.node()->as<UdpPortListSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}